

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::ColourImpl::ColourGuard::engageImpl(ColourGuard *this,ostream *stream)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 in_RDX;
  
  this->m_engaged = true;
  UNRECOVERED_JUMPTABLE = this->m_colourImpl->_vptr_ColourImpl[2];
  (*UNRECOVERED_JUMPTABLE)(this->m_colourImpl,(ulong)this->m_code,in_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void ColourImpl::ColourGuard::engageImpl( std::ostream& stream ) {
        assert( &stream == &m_colourImpl->m_stream->stream() &&
                "Engaging colour guard for different stream than used by the "
                "parent colour implementation" );
        static_cast<void>( stream );

        m_engaged = true;
        m_colourImpl->use( m_code );
    }